

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

double absl::lts_20250127::base_internal::NominalCPUFrequency(void)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  long lVar6;
  int i;
  int iVar7;
  int sleep_nanoseconds;
  bool bVar8;
  double dVar9;
  TimeTscPair TVar10;
  TimeTscPair TVar11;
  double local_438;
  char *local_430;
  char line [1024];
  
  if (init_nominal_cpu_frequency_once == 0xdd) {
    return nominal_cpu_frequency;
  }
  if ((((init_nominal_cpu_frequency_once != 0) && (init_nominal_cpu_frequency_once != 0xdd)) &&
      (init_nominal_cpu_frequency_once != 0x5a308d2)) &&
     (init_nominal_cpu_frequency_once != 0x65c2937b)) {
    raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                  ,0xa4,
                  "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/sysinfo.cc:384:7), Args = <>]"
                 );
  }
  LOCK();
  bVar8 = init_nominal_cpu_frequency_once == 0;
  if (bVar8) {
    init_nominal_cpu_frequency_once = 0x65c2937b;
  }
  UNLOCK();
  if ((!bVar8) &&
     (uVar1 = SpinLockWait((atomic<unsigned_int> *)&init_nominal_cpu_frequency_once,3,
                           (SpinLockWaitTransition *)
                           CallOnceImpl<absl::lts_20250127::base_internal::NominalCPUFrequency()::$_0>(std::atomic<unsigned_int>*,absl::lts_20250127::base_internal::SchedulingMode,absl::lts_20250127::base_internal::NominalCPUFrequency()::$_0&&)
                           ::trans,SCHEDULE_KERNEL_ONLY), uVar1 != 0)) {
    return nominal_cpu_frequency;
  }
  iVar7 = 0;
  iVar2 = open("/sys/devices/system/cpu/cpu0/tsc_freq_khz",0x80000);
  if (iVar2 != -1) {
    memset(line,0,0x400);
    do {
      sVar4 = read(iVar2,line,0x3ff);
      if (-1 < sVar4) {
        if (sVar4 != 0) {
          lVar6 = strtol(line,&local_430,10);
          if ((line[0] != '\0') && ((*local_430 == '\n' || (*local_430 == '\0')))) {
            local_438 = (double)lVar6 * 1000.0;
            bVar8 = true;
            goto LAB_00d28c0b;
          }
        }
        break;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    local_438 = 0.0;
    bVar8 = false;
LAB_00d28c0b:
    close(iVar2);
    if (bVar8) goto LAB_00d28c1c;
  }
  iVar2 = 1000000;
  dVar9 = -1.0;
  for (; local_438 = dVar9, iVar7 != 8; iVar7 = iVar7 + 1) {
    TVar10 = GetTimeTscPair();
    line[0] = '\0';
    line[1] = '\0';
    line[2] = '\0';
    line[3] = '\0';
    line[4] = '\0';
    line[5] = '\0';
    line[6] = '\0';
    line[7] = '\0';
    line._8_8_ = SEXT48(iVar2);
    do {
      iVar3 = nanosleep((timespec *)line,(timespec *)line);
      if (iVar3 == 0) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    TVar11 = GetTimeTscPair();
    local_438 = (double)(TVar11.tsc - TVar10.tsc) / ((double)(TVar11.time - TVar10.time) * 1e-09);
    if ((local_438 * 0.99 < dVar9) && (dVar9 < local_438 * 1.01)) break;
    iVar2 = iVar2 * 2;
    dVar9 = local_438;
  }
LAB_00d28c1c:
  iVar2 = init_nominal_cpu_frequency_once;
  LOCK();
  init_nominal_cpu_frequency_once = 0xdd;
  UNLOCK();
  nominal_cpu_frequency = local_438;
  if (iVar2 == 0x5a308d2) {
    AbslInternalSpinLockWake_lts_20250127
              ((atomic<unsigned_int> *)&init_nominal_cpu_frequency_once,true);
  }
  return nominal_cpu_frequency;
}

Assistant:

pid_t GetTID() {
  // `pthread_t` need not be arithmetic per POSIX; platforms where it isn't
  // should be handled above.
  return static_cast<pid_t>(pthread_self());
}